

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writeImpUseDescriptor(IsoWriter *this)

{
  uint32_t tagLocation;
  char *pcVar1;
  uint8_t *buffer;
  uint8_t *puVar2;
  allocator<char> local_39;
  string local_38 [8];
  string impId;
  uint32_t *buff32;
  IsoWriter *this_local;
  
  puVar2 = this->m_buffer;
  memset(puVar2,0,0x800);
  tagLocation = absoluteSectorNum(this);
  anon_unknown.dwarf_b4dde::writeDescriptorTag(puVar2,ImplUseVol,tagLocation);
  this->m_buffer[0x10] = '\x01';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  impId.field_2._8_8_ = puVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"*UDF LV Info",&local_39);
  std::allocator<char>::~allocator(&local_39);
  this->m_buffer[0x14] = '\0';
  puVar2 = this->m_buffer + 0x14;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  anon_unknown.dwarf_b4dde::writeUDFString(this->m_buffer + 0x14,pcVar1,0x20);
  this->m_buffer[0x34] = '\0';
  strcpy((char *)(this->m_buffer + 0x35),"OSTA Compressed Unicode");
  buffer = (uint8_t *)std::__cxx11::string::c_str();
  anon_unknown.dwarf_b4dde::writeDString
            ((anon_unknown_dwarf_b4dde *)(this->m_buffer + 0x74),buffer,(char *)0x80,(size_t)puVar2)
  ;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x161),pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x180),pcVar1);
  anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0x200);
  File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,(size_t)puVar2);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void IsoWriter::writeImpUseDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::ImplUseVol, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    buff32[4] = 0x01;  // Descriptor Sequence Number

    const std::string impId = std::string("*UDF LV Info");
    m_buffer[20] = 0x00;
    writeUDFString(m_buffer + 20, impId.c_str(), 32);

    // Explanatory Character Set
    m_buffer[52] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 53, "OSTA Compressed Unicode");

    // logical volume identifier
    writeDString(m_buffer + 116, m_volumeLabel.c_str(), 128);

    strcpy(reinterpret_cast<char *>(m_buffer) + 0x161, m_impId.c_str());  // ImplementationID
    strcpy(reinterpret_cast<char *>(m_buffer) + 0x180, m_appId.c_str());  // ImplementationUse

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}